

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,
          span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *args_1)

{
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> elements;
  InstanceNameSyntax *pIVar1;
  undefined8 *in_RDX;
  size_t in_stack_ffffffffffffff98;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffa0;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_ffffffffffffffa8;
  InstanceNameSyntax *in_stack_ffffffffffffffb0;
  Token in_stack_ffffffffffffffb8;
  
  pIVar1 = (InstanceNameSyntax *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa0._M_extent_value,in_stack_ffffffffffffff98);
  elements._M_extent._M_extent_value = in_stack_ffffffffffffffa0._M_extent_value;
  elements._M_ptr = (pointer)in_RDX[1];
  slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)*in_RDX,elements);
  slang::syntax::InstanceNameSyntax::InstanceNameSyntax
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }